

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void mbedtls_sha512_finish(mbedtls_sha512_context *ctx,uchar *output)

{
  ulong uVar1;
  long lVar2;
  size_t local_50;
  uchar local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  byte local_41;
  uchar msglen [16];
  uint64_t low;
  uint64_t high;
  size_t padn;
  size_t last;
  uchar *output_local;
  mbedtls_sha512_context *ctx_local;
  
  lVar2 = ctx->total[1] << 3;
  local_41 = (byte)(ctx->total[0] >> 0x3d) | (byte)lVar2;
  msglen._8_8_ = ctx->total[0] << 3;
  local_48 = (uchar)((ulong)lVar2 >> 0x38);
  local_47 = (undefined1)((ulong)lVar2 >> 0x30);
  local_46 = (undefined1)((ulong)lVar2 >> 0x28);
  local_45 = (undefined1)((ulong)lVar2 >> 0x20);
  local_44 = (undefined1)((ulong)lVar2 >> 0x18);
  local_43 = (undefined1)((ulong)lVar2 >> 0x10);
  local_42 = (undefined1)((ulong)lVar2 >> 8);
  msglen[0] = (uchar)((ulong)msglen._8_8_ >> 0x38);
  msglen[1] = (uchar)((ulong)msglen._8_8_ >> 0x30);
  msglen[2] = (uchar)((ulong)msglen._8_8_ >> 0x28);
  msglen[3] = (uchar)((ulong)msglen._8_8_ >> 0x20);
  msglen[4] = (uchar)((ulong)msglen._8_8_ >> 0x18);
  msglen[5] = (uchar)((ulong)msglen._8_8_ >> 0x10);
  msglen[6] = (uchar)((ulong)msglen._8_8_ >> 8);
  msglen[7] = (uchar)msglen._8_8_;
  uVar1 = ctx->total[0] & 0x7f;
  if (uVar1 < 0x70) {
    local_50 = 0x70 - uVar1;
  }
  else {
    local_50 = 0xf0 - uVar1;
  }
  mbedtls_sha512_update(ctx,sha512_padding,local_50);
  mbedtls_sha512_update(ctx,&local_48,0x10);
  *output = (uchar)(ctx->state[0] >> 0x38);
  output[1] = (uchar)(ctx->state[0] >> 0x30);
  output[2] = (uchar)(ctx->state[0] >> 0x28);
  output[3] = (uchar)(ctx->state[0] >> 0x20);
  output[4] = (uchar)(ctx->state[0] >> 0x18);
  output[5] = (uchar)(ctx->state[0] >> 0x10);
  output[6] = (uchar)(ctx->state[0] >> 8);
  output[7] = (uchar)ctx->state[0];
  output[8] = (uchar)(ctx->state[1] >> 0x38);
  output[9] = (uchar)(ctx->state[1] >> 0x30);
  output[10] = (uchar)(ctx->state[1] >> 0x28);
  output[0xb] = (uchar)(ctx->state[1] >> 0x20);
  output[0xc] = (uchar)(ctx->state[1] >> 0x18);
  output[0xd] = (uchar)(ctx->state[1] >> 0x10);
  output[0xe] = (uchar)(ctx->state[1] >> 8);
  output[0xf] = (uchar)ctx->state[1];
  output[0x10] = (uchar)(ctx->state[2] >> 0x38);
  output[0x11] = (uchar)(ctx->state[2] >> 0x30);
  output[0x12] = (uchar)(ctx->state[2] >> 0x28);
  output[0x13] = (uchar)(ctx->state[2] >> 0x20);
  output[0x14] = (uchar)(ctx->state[2] >> 0x18);
  output[0x15] = (uchar)(ctx->state[2] >> 0x10);
  output[0x16] = (uchar)(ctx->state[2] >> 8);
  output[0x17] = (uchar)ctx->state[2];
  output[0x18] = (uchar)(ctx->state[3] >> 0x38);
  output[0x19] = (uchar)(ctx->state[3] >> 0x30);
  output[0x1a] = (uchar)(ctx->state[3] >> 0x28);
  output[0x1b] = (uchar)(ctx->state[3] >> 0x20);
  output[0x1c] = (uchar)(ctx->state[3] >> 0x18);
  output[0x1d] = (uchar)(ctx->state[3] >> 0x10);
  output[0x1e] = (uchar)(ctx->state[3] >> 8);
  output[0x1f] = (uchar)ctx->state[3];
  output[0x20] = (uchar)(ctx->state[4] >> 0x38);
  output[0x21] = (uchar)(ctx->state[4] >> 0x30);
  output[0x22] = (uchar)(ctx->state[4] >> 0x28);
  output[0x23] = (uchar)(ctx->state[4] >> 0x20);
  output[0x24] = (uchar)(ctx->state[4] >> 0x18);
  output[0x25] = (uchar)(ctx->state[4] >> 0x10);
  output[0x26] = (uchar)(ctx->state[4] >> 8);
  output[0x27] = (uchar)ctx->state[4];
  output[0x28] = (uchar)(ctx->state[5] >> 0x38);
  output[0x29] = (uchar)(ctx->state[5] >> 0x30);
  output[0x2a] = (uchar)(ctx->state[5] >> 0x28);
  output[0x2b] = (uchar)(ctx->state[5] >> 0x20);
  output[0x2c] = (uchar)(ctx->state[5] >> 0x18);
  output[0x2d] = (uchar)(ctx->state[5] >> 0x10);
  output[0x2e] = (uchar)(ctx->state[5] >> 8);
  output[0x2f] = (uchar)ctx->state[5];
  if (ctx->is384 == 0) {
    output[0x30] = (uchar)(ctx->state[6] >> 0x38);
    output[0x31] = (uchar)(ctx->state[6] >> 0x30);
    output[0x32] = (uchar)(ctx->state[6] >> 0x28);
    output[0x33] = (uchar)(ctx->state[6] >> 0x20);
    output[0x34] = (uchar)(ctx->state[6] >> 0x18);
    output[0x35] = (uchar)(ctx->state[6] >> 0x10);
    output[0x36] = (uchar)(ctx->state[6] >> 8);
    output[0x37] = (uchar)ctx->state[6];
    output[0x38] = (uchar)(ctx->state[7] >> 0x38);
    output[0x39] = (uchar)(ctx->state[7] >> 0x30);
    output[0x3a] = (uchar)(ctx->state[7] >> 0x28);
    output[0x3b] = (uchar)(ctx->state[7] >> 0x20);
    output[0x3c] = (uchar)(ctx->state[7] >> 0x18);
    output[0x3d] = (uchar)(ctx->state[7] >> 0x10);
    output[0x3e] = (uchar)(ctx->state[7] >> 8);
    output[0x3f] = (uchar)ctx->state[7];
  }
  return;
}

Assistant:

void mbedtls_sha512_finish( mbedtls_sha512_context *ctx, unsigned char output[64] )
{
    size_t last, padn;
    uint64_t high, low;
    unsigned char msglen[16];

    high = ( ctx->total[0] >> 61 )
         | ( ctx->total[1] <<  3 );
    low  = ( ctx->total[0] <<  3 );

    PUT_UINT64_BE( high, msglen, 0 );
    PUT_UINT64_BE( low,  msglen, 8 );

    last = (size_t)( ctx->total[0] & 0x7F );
    padn = ( last < 112 ) ? ( 112 - last ) : ( 240 - last );

    mbedtls_sha512_update( ctx, sha512_padding, padn );
    mbedtls_sha512_update( ctx, msglen, 16 );

    PUT_UINT64_BE( ctx->state[0], output,  0 );
    PUT_UINT64_BE( ctx->state[1], output,  8 );
    PUT_UINT64_BE( ctx->state[2], output, 16 );
    PUT_UINT64_BE( ctx->state[3], output, 24 );
    PUT_UINT64_BE( ctx->state[4], output, 32 );
    PUT_UINT64_BE( ctx->state[5], output, 40 );

    if( ctx->is384 == 0 )
    {
        PUT_UINT64_BE( ctx->state[6], output, 48 );
        PUT_UINT64_BE( ctx->state[7], output, 56 );
    }
}